

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walWriteToLog(WalWriter *p,void *pContent,int iAmt,sqlite3_int64 iOffset)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  lVar1 = p->iSyncPoint;
  if ((lVar1 - iOffset == 0 || lVar1 < iOffset) || (iAmt + iOffset < lVar1)) {
LAB_00146156:
    iVar2 = (*p->pFd->pMethods->xWrite)(p->pFd,pContent,iAmt,iOffset);
    return iVar2;
  }
  iVar4 = (int)(lVar1 - iOffset);
  iVar2 = (*p->pFd->pMethods->xWrite)(p->pFd,pContent,iVar4,iOffset);
  if (iVar2 == 0) {
    iAmt = iAmt - iVar4;
    uVar3 = p->syncFlags & 3;
    if (uVar3 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*p->pFd->pMethods->xSync)(p->pFd,uVar3);
    }
    if ((iAmt != 0) && (iVar2 == 0)) {
      iOffset = iOffset + iVar4;
      pContent = (void *)((long)pContent + (long)iVar4);
      goto LAB_00146156;
    }
  }
  return iVar2;
}

Assistant:

static int walWriteToLog(
  WalWriter *p,              /* WAL to write to */
  void *pContent,            /* Content to be written */
  int iAmt,                  /* Number of bytes to write */
  sqlite3_int64 iOffset      /* Start writing at this offset */
){
  int rc;
  if( iOffset<p->iSyncPoint && iOffset+iAmt>=p->iSyncPoint ){
    int iFirstAmt = (int)(p->iSyncPoint - iOffset);
    rc = sqlite3OsWrite(p->pFd, pContent, iFirstAmt, iOffset);
    if( rc ) return rc;
    iOffset += iFirstAmt;
    iAmt -= iFirstAmt;
    pContent = (void*)(iFirstAmt + (char*)pContent);
    assert( WAL_SYNC_FLAGS(p->syncFlags)!=0 );
    rc = sqlite3OsSync(p->pFd, WAL_SYNC_FLAGS(p->syncFlags));
    if( iAmt==0 || rc ) return rc;
  }
  rc = sqlite3OsWrite(p->pFd, pContent, iAmt, iOffset);
  return rc;
}